

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bold.cpp
# Opt level: O3

void __thiscall ftxui::Bold::Render(Bold *this,Screen *screen)

{
  bool bVar1;
  int iVar2;
  Pixel *pPVar3;
  int iVar4;
  int x;
  int y;
  
  y = (this->super_NodeDecorator).super_Node.box_.y_min;
  iVar4 = (this->super_NodeDecorator).super_Node.box_.y_max;
  if (y <= iVar4) {
    iVar2 = (this->super_NodeDecorator).super_Node.box_.x_max;
    do {
      x = (this->super_NodeDecorator).super_Node.box_.x_min;
      if (x <= iVar2) {
        do {
          pPVar3 = Screen::PixelAt(screen,x,y);
          pPVar3->field_0x28 = pPVar3->field_0x28 | 2;
          iVar2 = (this->super_NodeDecorator).super_Node.box_.x_max;
          bVar1 = x < iVar2;
          x = x + 1;
        } while (bVar1);
        iVar4 = (this->super_NodeDecorator).super_Node.box_.y_max;
      }
      bVar1 = y < iVar4;
      y = y + 1;
    } while (bVar1);
  }
  Node::Render((Node *)this,screen);
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y).bold = true;
      }
    }
    Node::Render(screen);
  }